

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-ransom-note.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  istream *this;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  int n;
  int m;
  string word;
  Trie trie;
  int local_200;
  int local_1fc;
  string local_1f8;
  Trie local_1d8;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_1fc);
  std::istream::operator>>(this,&local_200);
  iVar5 = 0;
  memset(&local_1d8,0,0x1a8);
  paVar1 = &local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  if (0 < local_1fc) {
    do {
      std::operator>>((istream *)&std::cin,(string *)&local_1f8);
      Trie::add(&local_1d8,&local_1f8);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_1fc);
  }
  if (local_200 < 1) {
    uVar3 = 3;
    pcVar6 = "Yes";
  }
  else {
    bVar4 = 1;
    iVar5 = 0;
    do {
      std::operator>>((istream *)&std::cin,(string *)&local_1f8);
      bVar2 = Trie::use(&local_1d8,&local_1f8);
      bVar4 = bVar4 & bVar2;
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_200);
    pcVar6 = "No";
    if (bVar4 != 0) {
      pcVar6 = "Yes";
    }
    uVar3 = (ulong)bVar4 | 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,uVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p,
                    CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                             local_1f8.field_2._M_local_buf[0]) + 1);
  }
  Trie::~Trie(&local_1d8);
  return 0;
}

Assistant:

int main() {
  int m, n;
  std::cin >> m >> n;
  Trie trie;
  std::string word;
  for (int i = 0; i < m; ++i) {
    std::cin >> word;
    trie.add(word);
  }
  bool doable = true;
  for (int i = 0; i < n; ++i) {
    std::cin >> word;
    doable &= trie.use(word);
  }
  std::cout << (doable ? "Yes" : "No") << std::endl;
}